

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BacktrackingTokenStream.h
# Opt level: O2

void __thiscall
SGParser::BacktrackingTokenStream<SGParser::GenericToken>::BacktrackingTokenStream
          (BacktrackingTokenStream<SGParser::GenericToken> *this)

{
  _Rb_tree_header *p_Var1;
  StreamBlock *this_00;
  
  (this->super_TokenStream<SGParser::GenericToken>)._vptr_TokenStream =
       (_func_int **)&PTR__BacktrackingTokenStream_0015a328;
  this->pSourceStream = (TokenStream<SGParser::GenericToken> *)0x0;
  this_00 = (StreamBlock *)operator_new(0x7018);
  StreamBlock::StreamBlock(this_00);
  this->pFirstBlock = this_00;
  this->pThisBlock = this_00;
  this->ThisPos = 0;
  this->RememberLength = 1;
  (this->Markers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->Markers)._M_t._M_impl.super__Rb_tree_header;
  (this->Markers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this->LengthLeft = 0;
  this->Pos = 0;
  this->SourceEOFFlag = false;
  (this->Markers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Markers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Markers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

BacktrackingTokenStream<Token>::BacktrackingTokenStream()
    : pSourceStream{nullptr},
      pFirstBlock{new StreamBlock}, // Allocate 1 stream block
      pThisBlock{pFirstBlock},
      ThisPos{0u},
      RememberLength{1u},
      LengthLeft{0u},
      Pos{0u},
      SourceEOFFlag{false} {
}